

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmTarget * __thiscall
cmMakefile::GetCustomCommandTarget
          (cmMakefile *this,string *target,cmObjectLibraryCommands objLibCommands,
          cmListFileBacktrace *lfbt)

{
  bool bVar1;
  PolicyStatus PVar2;
  TargetType TVar3;
  pointer ppVar4;
  pointer ppVar5;
  ostream *poVar6;
  cmake *pcVar7;
  PolicyID id;
  string local_588;
  undefined1 local_568 [8];
  ostringstream e_2;
  string local_3f0;
  undefined1 local_3d0 [8];
  ostringstream e_1;
  cmTarget *t;
  string local_248;
  cmTarget *local_228;
  cmTarget *t_1;
  undefined1 local_200 [8];
  ostringstream e;
  MessageType local_84;
  bool issueMessage;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  _Stack_80;
  MessageType messageType;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_78;
  iterator ti;
  _Self local_58;
  const_iterator ai;
  string realTarget;
  cmListFileBacktrace *lfbt_local;
  cmObjectLibraryCommands objLibCommands_local;
  string *target_local;
  cmMakefile *this_local;
  
  std::__cxx11::string::string((string *)&ai,(string *)target);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->AliasTargets,target);
  ti.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
             )std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(&this->AliasTargets);
  bVar1 = std::operator!=(&local_58,(_Self *)&ti);
  if (bVar1) {
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_58);
    std::__cxx11::string::operator=((string *)&ai,(string *)&ppVar4->second);
  }
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
       ::find(&this->Targets,(key_type *)&ai);
  _Stack_80._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
       ::end(&this->Targets);
  bVar1 = std::__detail::operator==(&local_78,&stack0xffffffffffffff80);
  if (bVar1) {
    local_84 = AUTHOR_WARNING;
    bVar1 = false;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    PVar2 = GetPolicyStatus(this,CMP0040,false);
    if (PVar2 != OLD) {
      if (PVar2 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&t_1,(cmPolicies *)0x28,id);
        poVar6 = std::operator<<((ostream *)local_200,(string *)&t_1);
        std::operator<<(poVar6,"\n");
        std::__cxx11::string::~string((string *)&t_1);
        bVar1 = true;
      }
      else if (PVar2 - NEW < 3) {
        bVar1 = true;
        local_84 = FATAL_ERROR;
      }
    }
    if (bVar1) {
      local_228 = FindTargetToUse(this,target,false);
      if (local_228 == (cmTarget *)0x0) {
        poVar6 = std::operator<<((ostream *)local_200,"No TARGET \'");
        poVar6 = std::operator<<(poVar6,(string *)target);
        std::operator<<(poVar6,"\' has been created in this directory.");
      }
      else {
        bVar1 = cmTarget::IsImported(local_228);
        if (bVar1) {
          poVar6 = std::operator<<((ostream *)local_200,"TARGET \'");
          poVar6 = std::operator<<(poVar6,(string *)target);
          std::operator<<(poVar6,"\' is IMPORTED and does not build here.");
        }
        else {
          poVar6 = std::operator<<((ostream *)local_200,"TARGET \'");
          poVar6 = std::operator<<(poVar6,(string *)target);
          std::operator<<(poVar6,"\' was not created in this directory.");
        }
      }
      pcVar7 = GetCMakeInstance(this);
      std::__cxx11::ostringstream::str();
      cmake::IssueMessage(pcVar7,local_84,&local_248,lfbt);
      std::__cxx11::string::~string((string *)&local_248);
    }
    this_local = (cmMakefile *)0x0;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  }
  else {
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                           *)&local_78);
    this_local = (cmMakefile *)&ppVar5->second;
    if ((objLibCommands == Reject) &&
       (TVar3 = cmTarget::GetType((cmTarget *)this_local), TVar3 == OBJECT_LIBRARY)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
      poVar6 = std::operator<<((ostream *)local_3d0,"Target \"");
      poVar6 = std::operator<<(poVar6,(string *)target);
      std::operator<<(poVar6,
                      "\" is an OBJECT library that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands."
                     );
      pcVar7 = GetCMakeInstance(this);
      std::__cxx11::ostringstream::str();
      cmake::IssueMessage(pcVar7,FATAL_ERROR,&local_3f0,lfbt);
      std::__cxx11::string::~string((string *)&local_3f0);
      this_local = (cmMakefile *)0x0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
    }
    else {
      TVar3 = cmTarget::GetType((cmTarget *)this_local);
      if (TVar3 == INTERFACE_LIBRARY) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_568);
        poVar6 = std::operator<<((ostream *)local_568,"Target \"");
        poVar6 = std::operator<<(poVar6,(string *)target);
        std::operator<<(poVar6,
                        "\" is an INTERFACE library that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands."
                       );
        pcVar7 = GetCMakeInstance(this);
        std::__cxx11::ostringstream::str();
        cmake::IssueMessage(pcVar7,FATAL_ERROR,&local_588,lfbt);
        std::__cxx11::string::~string((string *)&local_588);
        this_local = (cmMakefile *)0x0;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_568);
      }
    }
  }
  std::__cxx11::string::~string((string *)&ai);
  return (cmTarget *)this_local;
}

Assistant:

cmTarget* cmMakefile::GetCustomCommandTarget(
  const std::string& target, cmObjectLibraryCommands objLibCommands,
  const cmListFileBacktrace& lfbt) const
{
  auto realTarget = target;

  auto ai = this->AliasTargets.find(target);
  if (ai != this->AliasTargets.end()) {
    realTarget = ai->second;
  }

  // Find the target to which to add the custom command.
  auto ti = this->Targets.find(realTarget);
  if (ti == this->Targets.end()) {
    MessageType messageType = MessageType::AUTHOR_WARNING;
    bool issueMessage = false;
    std::ostringstream e;
    switch (this->GetPolicyStatus(cmPolicies::CMP0040)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0040) << "\n";
        issueMessage = true;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (issueMessage) {
      if (cmTarget const* t = this->FindTargetToUse(target)) {
        if (t->IsImported()) {
          e << "TARGET '" << target
            << "' is IMPORTED and does not build here.";
        } else {
          e << "TARGET '" << target << "' was not created in this directory.";
        }
      } else {
        e << "No TARGET '" << target
          << "' has been created in this directory.";
      }
      this->GetCMakeInstance()->IssueMessage(messageType, e.str(), lfbt);
    }

    return nullptr;
  }

  cmTarget* t = &ti->second;
  if (objLibCommands == cmObjectLibraryCommands::Reject &&
      t->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << target
      << "\" is an OBJECT library "
         "that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands.";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                           lfbt);
    return nullptr;
  }
  if (t->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << target
      << "\" is an INTERFACE library "
         "that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands.";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                           lfbt);
    return nullptr;
  }

  return t;
}